

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O2

Module * remote::GetModuleHandle(Module *__return_storage_ptr__,Handle proc,string *filename)

{
  int iVar1;
  ostream *poVar2;
  pointer pRVar3;
  Handle proc_local;
  vector<remote::Region,_std::allocator<remote::Region>_> regs;
  vector<remote::Region,_std::allocator<remote::Region>_> local_d8;
  vector<remote::Region,_std::allocator<remote::Region>_> processRegions;
  Region reg;
  
  proc_local = proc;
  Handle::GetRegions(&processRegions,&proc_local);
  if (processRegions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      processRegions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
      super__Vector_impl_data._M_start) {
    Module::Module(__return_storage_ptr__);
  }
  else {
    regs.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    regs.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    regs.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (pRVar3 = processRegions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pRVar3 != processRegions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pRVar3 = pRVar3 + 1) {
      Region::Region(&reg,pRVar3);
      iVar1 = std::__cxx11::string::compare((string *)&reg.filename);
      if (iVar1 == 0) {
        std::vector<remote::Region,_std::allocator<remote::Region>_>::push_back(&regs,&reg);
      }
      Region::~Region(&reg);
    }
    std::vector<remote::Region,_std::allocator<remote::Region>_>::vector(&local_d8,&regs);
    Module::Module(__return_storage_ptr__,&local_d8);
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_d8);
    if ((__return_storage_ptr__->regions).
        super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (__return_storage_ptr__->regions).
        super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
        super__Vector_impl_data._M_start) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Regions: ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"Path: ");
      Module::GetPath_abi_cxx11_((string *)&reg,__return_storage_ptr__);
      poVar2 = std::operator<<(poVar2,(string *)&reg);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&reg);
      Module::CacheSymbolData(__return_storage_ptr__);
    }
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&regs);
  }
  std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&processRegions);
  return __return_storage_ptr__;
}

Assistant:

Module remote::GetModuleHandle(Handle proc, string filename) {
    vector<Region> processRegions = proc.GetRegions();

    if(processRegions.size() == 0) {
        return Module();
    }

    vector<Region> regs;

    for(auto reg : processRegions) {
        if(reg.filename.compare(filename) == 0) {
            regs.push_back(reg);
        }
    }

    Module ret = Module(regs);

    if(ret.IsValid()) {
        std::cout << "Regions: " << std::hex << ret.GetRegionCount() << std::endl;
        std::cout << "Path: " << ret.GetPath() << std::endl;

        ret.CacheSymbolData();
    }

    return ret;
}